

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_cfg_analysis.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::StructuredCFGAnalysis::NestingDepth(StructuredCFGAnalysis *this,uint32_t bb_id)

{
  uint32_t bb_id_00;
  uint32_t uVar1;
  
  bb_id_00 = MergeBlock(this,bb_id);
  uVar1 = 0;
  for (; bb_id_00 != 0; bb_id_00 = MergeBlock(this,bb_id_00)) {
    uVar1 = uVar1 + 1;
  }
  return uVar1;
}

Assistant:

uint32_t StructuredCFGAnalysis::NestingDepth(uint32_t bb_id) {
  uint32_t result = 0;

  // Find the merge block of the current merge construct as long as the block is
  // inside a merge construct, exiting one for each iteration.
  for (uint32_t merge_block_id = MergeBlock(bb_id); merge_block_id != 0;
       merge_block_id = MergeBlock(merge_block_id)) {
    result++;
  }

  return result;
}